

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pool.cpp
# Opt level: O1

void __thiscall AGSSock::Pool::run(Pool *this)

{
  Mutex *__mutex;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint *puVar2;
  Beacon *pBVar3;
  int iVar4;
  _Hash_node_base *p_Var5;
  ulong uVar6;
  uint *puVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  _Node_iterator_base<AGSSock::Socket_*,_false> __it;
  long lVar11;
  _Node_iterator<AGSSock::Socket_*,_true,_false> __tmp;
  _Node_iterator_base<AGSSock::Socket_*,_false> _Var12;
  Sockets *__range3;
  uint uVar13;
  int iVar14;
  Lock lock;
  fd_set read;
  char buffer [65536];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_100e8;
  ulong uStack_100c8;
  Beacon *pBStack_100c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_100b8;
  undefined8 uStack_10098;
  undefined8 uStack_10090;
  undefined8 uStack_10088;
  undefined8 uStack_10080;
  undefined8 uStack_10078;
  undefined8 uStack_10070;
  undefined8 uStack_10068;
  undefined8 uStack_10060;
  undefined8 uStack_10058;
  undefined8 uStack_10050;
  undefined8 uStack_10048;
  undefined8 uStack_10040;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> abStack_10038 [2048];
  
  pBStack_100c0 = &this->beacon_;
  uStack_100c8 = (ulong)(uint)(this->beacon_).data.fd[0];
  puts("\t\tThread started");
  __mutex = &this->guard_;
  do {
    uVar6 = uStack_100c8;
    uStack_10048 = 0;
    uStack_10040 = 0;
    uStack_10058 = 0;
    uStack_10050 = 0;
    uStack_10068 = 0;
    uStack_10060 = 0;
    uStack_10078 = 0;
    uStack_10070 = 0;
    uStack_10088 = 0;
    uStack_10080 = 0;
    uStack_10098 = 0;
    uStack_10090 = 0;
    bStack_100b8.field_2._M_allocated_capacity = 0;
    bStack_100b8.field_2._8_8_ = 0;
    bStack_100b8._M_dataplus._M_p = (pointer)0x0;
    bStack_100b8._M_string_length = 0;
    iVar14 = (int)uStack_100c8;
    iVar4 = iVar14 + 0x3f;
    if (-1 < iVar14) {
      iVar4 = iVar14;
    }
    uVar9 = 1L << ((byte)uStack_100c8 & 0x3f);
    (&bStack_100b8._M_dataplus)[iVar4 >> 6]._M_p =
         (pointer)((ulong)(&bStack_100b8._M_dataplus)[iVar4 >> 6]._M_p | uVar9);
    pthread_mutex_lock((pthread_mutex_t *)__mutex);
    uVar6 = uVar6 & 0xffffffff;
    for (p_Var5 = (this->sockets_)._M_h._M_before_begin._M_nxt; uVar13 = (uint)uVar6,
        p_Var5 != (_Hash_node_base *)0x0; p_Var5 = p_Var5->_M_nxt) {
      uVar8 = *(uint *)&(p_Var5[1]._M_nxt)->_M_nxt;
      uVar10 = uVar8 + 0x3f;
      if (-1 < (int)uVar8) {
        uVar10 = uVar8;
      }
      (&bStack_100b8._M_dataplus)[(int)uVar10 >> 6]._M_p =
           (pointer)((ulong)(&bStack_100b8._M_dataplus)[(int)uVar10 >> 6]._M_p |
                    1L << ((byte)uVar8 & 0x3f));
      if ((int)uVar8 < (int)uVar13) {
        uVar8 = uVar13;
      }
      uVar6 = (ulong)uVar8;
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    __args = &bStack_100b8;
    select(uVar13 + 1,(fd_set *)__args,(fd_set *)0x0,(fd_set *)0x0,(timeval *)0x0);
    pthread_mutex_lock((pthread_mutex_t *)__mutex);
    pBVar3 = pBStack_100c0;
    if (((ulong)(&bStack_100b8._M_dataplus)[iVar4 >> 6]._M_p & uVar9) != 0) {
      AGSSockAPI::Beacon::reset(pBStack_100c0);
      uStack_100c8 = (ulong)(uint)(pBVar3->data).fd[0];
      puts("\t\tThread signalled");
    }
    iVar14 = (int)__args;
    paVar1 = &bStack_100e8.field_2;
    _Var12._M_cur = (__node_type *)(this->sockets_)._M_h._M_before_begin._M_nxt;
    while (__it._M_cur = _Var12._M_cur, __it._M_cur != (__node_type *)0x0) {
      puVar2 = *(uint **)((long)__it._M_cur + 8);
      uVar13 = *puVar2;
      uVar8 = uVar13 + 0x3f;
      if (-1 < (int)uVar13) {
        uVar8 = uVar13;
      }
      if (((ulong)(&bStack_100b8._M_dataplus)[(int)uVar8 >> 6]._M_p >> ((ulong)uVar13 & 0x3f) & 1)
          == 0) {
LAB_0010a9b0:
        _Var12._M_cur = *__it._M_cur;
        __it._M_cur = (__node_type *)__args;
      }
      else {
        __args = abStack_10038;
        uVar6 = recv(*puVar2,abStack_10038,0x10000,0);
        puVar7 = (uint *)__errno_location();
        iVar14 = (int)uVar6;
        if (*puVar7 == 0xb && iVar14 == -1) {
          _Var12._M_cur = *__it._M_cur;
          __it._M_cur = (__node_type *)__args;
        }
        else {
          if (iVar14 == -1) {
            puVar2[0x26] = *puVar7;
          }
          else {
            if (puVar2[2] == 1) {
              if (((uVar6 & 0xffffffff) != 0) &&
                 (lVar11 = *(long *)(puVar2 + 0x1e), lVar11 != *(long *)(puVar2 + 0x16))) {
                if (lVar11 == *(long *)(puVar2 + 0x20)) {
                  lVar11 = *(long *)(*(long *)(puVar2 + 0x24) + -8) + 0x200;
                }
                __args = abStack_10038;
                std::__cxx11::string::append((char *)(lVar11 + -0x20),(ulong)abStack_10038);
                goto LAB_0010a98b;
              }
              bStack_100e8._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&bStack_100e8,abStack_10038,
                         (long)&abStack_10038[0]._M_dataplus._M_p + (long)iVar14);
              __args = &bStack_100e8;
              std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         (puVar2 + 0x12),__args);
            }
            else {
              bStack_100e8._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&bStack_100e8,abStack_10038,
                         (long)&abStack_10038[0]._M_dataplus._M_p + (long)iVar14);
              __args = &bStack_100e8;
              std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         (puVar2 + 0x12),__args);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)bStack_100e8._M_dataplus._M_p != paVar1) {
              __args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (bStack_100e8.field_2._M_allocated_capacity + 1);
              operator_delete(bStack_100e8._M_dataplus._M_p,(ulong)__args);
            }
          }
LAB_0010a98b:
          if ((iVar14 != -1) && ((iVar14 != 0 || (puVar2[2] != 1)))) goto LAB_0010a9b0;
          _Var12._M_cur = *__it._M_cur;
          std::
          _Hashtable<AGSSock::Socket_*,_AGSSock::Socket_*,_std::allocator<AGSSock::Socket_*>,_std::__detail::_Identity,_std::equal_to<AGSSock::Socket_*>,_std::hash<AGSSock::Socket_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::erase((_Hashtable<AGSSock::Socket_*,_AGSSock::Socket_*,_std::allocator<AGSSock::Socket_*>,_std::__detail::_Identity,_std::equal_to<AGSSock::Socket_*>,_std::hash<AGSSock::Socket_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)this,(const_iterator)__it._M_cur);
        }
      }
      iVar14 = (int)__it._M_cur;
      __args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__it._M_cur;
    }
    if ((this->sockets_)._M_h._M_element_count == 0) {
      puts("\t\tThread finished");
      AGSSockAPI::Thread::exit(&this->thread_,iVar14);
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      return;
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  } while( true );
}

Assistant:

void Pool::run()
{
	SOCKET signal = beacon_;
	fd_set read;
	int nfds;
	
	DEBUG_P("Thread started");
	for (;;) { /* event loop */
	
	// Reset FD sets
	FD_ZERO(&read);
	FD_SET(signal, &read);
	nfds = signal;
	
	// Add pool sockets to FD sets
	{
		Mutex::Lock lock(guard_);
		
		for (Socket *sock : sockets_)
		{
			FD_SET(sock->id, &read);
			// Windows ignores the nfds parameter, skip for efficiency
		#ifndef _WIN32
			if (nfds < sock->id)
				nfds = sock->id;
		#endif
		}
	}
	
	// Wait for events
	select(nfds + 1, &read, nullptr, nullptr, nullptr);
	// If select errs a socket was most likely closed locally, this is fine.
	// We need to check which one(s) and ignore all 'would block's.
	
	// Process read and error events
	{
		Mutex::Lock lock(guard_);
		
		if (FD_ISSET(signal, &read))
		{
			beacon_.reset();
			signal = beacon_;
			DEBUG_P("Thread signalled");
		}

		for (Sockets::iterator it = sockets_.begin(); it != sockets_.end();)
		{
			Socket *sock = *it;

			if (FD_ISSET(sock->id, &read))
			{
				char buffer[65536];
				int ret = recv(sock->id, buffer, sizeof (buffer), 0);
				int error = GET_ERROR();
				
				// We ignore sockets that would block:
				// This is normally filtered by select but a signal could have
				// interrupted select.
				if (ret == SOCKET_ERROR && WOULD_BLOCK(error))
				{
					++it;
					continue;
				}
				
				// If ret == 0 then closed gracefully (for TCP)
				// If ret == SOCKET_ERROR probably closed not so gracefully
				
				if (ret == SOCKET_ERROR)
					sock->incoming.error = error;
				else if (sock->type == SOCK_STREAM)
					sock->incoming.append(buffer, ret);
				else
					sock->incoming.push(buffer, ret);
				
				if ((ret == SOCKET_ERROR)
					|| (!ret && sock->type == SOCK_STREAM))
				{
					// This socket is done for, stop reading
					sockets_.erase(it++);
					continue;
				}	
			}

			++it;
		}
		
		// Close thread if there are no sockets to process anymore
		// Note: This is safe because the thread will be (re)started when
		//       sockets are added to the pool which requires the pool lock.
		if (sockets_.empty())
		{
			DEBUG_P("Thread finished");
			thread_.exit();
			return;
		}
	}
	
	} /* event loop */
	
	// Note: chaining the two critical sections might be more efficient as it
	// merges the loops, but this is not worth the hassle and might introduce
	// errors.
	
	DEBUG_P("Thread cancelled");
	thread_.exit();
	return;
}